

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferBufferParameters::queryBufferParameteri64v
          (TextureBufferBufferParameters *this,GLenum target,GLenum pname,GLint64 expected_data)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1b8;
  GLboolean local_31;
  Functions *pFStack_30;
  GLboolean test_passed;
  GLint64 result;
  Functions *gl;
  GLint64 expected_data_local;
  GLenum pname_local;
  GLenum target_local;
  TextureBufferBufferParameters *this_local;
  
  gl = (Functions *)expected_data;
  expected_data_local._0_4_ = pname;
  expected_data_local._4_4_ = target;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  result = CONCAT44(extraout_var,iVar1);
  pFStack_30 = (Functions *)&DAT_ffffffffffffffff;
  local_31 = '\x01';
  (**(code **)(result + 0x7a0))
            (expected_data_local._4_4_,(GLenum)expected_data_local,&stack0xffffffffffffffd0);
  err = (**(code **)(result + 0x800))();
  glu::checkError(err,"Could not query for value of buffer object\'s parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x94);
  if (pFStack_30 != gl) {
    local_31 = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [35])"glGetBufferParameteri64v(pname == ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&expected_data_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2c67c34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(long *)&stack0xffffffffffffffd0);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [39])" which is not equal to expected value ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(long *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return local_31;
}

Assistant:

glw::GLboolean TextureBufferBufferParameters::queryBufferParameteri64v(glw::GLenum target, glw::GLenum pname,
																	   glw::GLint64 expected_data)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint64   result	  = -1;
	glw::GLboolean test_passed = true;

	gl.getBufferParameteri64v(target, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query for value of buffer object's parameter!");

	if (result != expected_data)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetBufferParameteri64v(pname == " << pname << ") returned "
						   << result << " which is not equal to expected value " << expected_data << "."
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}